

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O0

void __thiscall QTextMarkdownImporter::import(QTextMarkdownImporter *this,QString *markdown)

{
  QStringView md_00;
  bool bVar1;
  int iVar2;
  QStringView *pQVar3;
  QDebug *pQVar4;
  long in_RDI;
  long in_FS_OFFSET;
  QTextDocument *doc;
  QByteArray mdUtf8;
  R_conflict7 split;
  QStringView md;
  MD_PARSER callbacks;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QFont defaultFont;
  QLoggingCategory *in_stack_fffffffffffffe58;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffe60;
  MD_PARSER *in_stack_fffffffffffffe68;
  QStringView *in_stack_fffffffffffffe70;
  MD_SIZE size;
  QDebug *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffea8;
  QDebug local_120 [4];
  undefined1 *local_100;
  undefined1 *local_f8;
  QFont *in_stack_ffffffffffffff10;
  QDebug *in_stack_ffffffffffffff18;
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  undefined4 local_78;
  Int local_74;
  code *local_70;
  code *local_68;
  code *local_60;
  code *local_58;
  code *local_50;
  code *local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_78,0xaa,0x40);
  local_78 = 0;
  local_74 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)(in_RDI + 200));
  local_70 = CbEnterBlock;
  local_68 = CbLeaveBlock;
  local_60 = CbEnterSpan;
  local_58 = CbLeaveSpan;
  local_50 = CbText;
  local_48 = CbDebugLog;
  local_40 = 0;
  pQVar3 = (QStringView *)QTextCursor::document((QTextCursor *)in_stack_fffffffffffffe58);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::defaultFont((QTextDocument *)in_stack_fffffffffffffe68);
  iVar2 = QFont::pointSize((QFont *)0x9fc8bc);
  *(int *)(in_RDI + 0xbc) = (iVar2 << 1) / 3;
  (**(code **)(*(long *)&pQVar3->m_size + 0x60))();
  iVar2 = QFont::pointSize((QFont *)0x9fc8eb);
  if (iVar2 == -1) {
    in_stack_fffffffffffffe78 = (QDebug *)(in_RDI + 0x88);
    QFont::pixelSize((QFont *)0x9fc938);
    QFont::setPixelSize((QFont *)in_stack_fffffffffffffe68,
                        (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  else {
    QFont::pointSize((QFont *)0x9fc90d);
    QFont::setPointSize((QFont *)in_stack_fffffffffffffe68,
                        (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = 0xaa;
  uStack_1f = 0xaaaaaaaaaaaaaa;
  lcMD();
  anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
    anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9fc99a);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
               (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),(char *)in_stack_fffffffffffffe58,
               (char *)0x9fc9b3);
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(in_stack_fffffffffffffe78,in_stack_fffffffffffffea8);
    QDebug::QDebug(&local_98,pQVar4);
    ::operator<<(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    pQVar4 = QDebug::operator<<(in_stack_fffffffffffffe78,in_stack_fffffffffffffea8);
    QDebug::QDebug(&local_88,pQVar4);
    ::operator<<(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug(&local_90);
    QDebug::~QDebug(&local_98);
    QDebug::~QDebug(&local_a0);
    local_20 = 0;
  }
  QStringView::QStringView<QString,_true>
            (in_stack_fffffffffffffe70,(QString *)in_stack_fffffffffffffe68);
  bVar1 = QFlags<QTextMarkdownImporter::Feature>::testFlag
                    ((QFlags<QTextMarkdownImporter::Feature> *)in_stack_fffffffffffffe60,
                     (Feature)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  size = (MD_SIZE)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  if (bVar1) {
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    md_00.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    md_00.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    splitFrontMatter(md_00);
    bVar1 = splitFrontMatter(QStringView)::R::operator_cast_to_bool((R_conflict7 *)0x9fcb71);
    if (bVar1) {
      QStringView::toString((QStringView *)in_stack_fffffffffffffe60);
      QTextDocument::setMetaInformation
                ((QTextDocument *)pQVar3,(MetaInformation)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                 ,(QString *)in_stack_fffffffffffffe60);
      QString::~QString((QString *)0x9fcbbd);
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      lcMD();
      anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38),
            in_stack_fffffffffffffe70 = pQVar3, bVar1) {
        anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9fcc13);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)pQVar3,(char *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),(char *)in_stack_fffffffffffffe58
                   ,(char *)0x9fcc29);
        QMessageLogger::debug();
        in_stack_fffffffffffffe68 =
             (MD_PARSER *)QDebug::operator<<(in_stack_fffffffffffffe78,in_stack_fffffffffffffea8);
        QStringView::size((QStringView *)&stack0xffffffffffffff10);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffe60,(qint64)in_stack_fffffffffffffe58);
        QDebug::~QDebug(local_120);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
    }
    size = (MD_SIZE)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  }
  pQVar3 = (QStringView *)&stack0xfffffffffffffea8;
  QStringView::toUtf8(pQVar3);
  QTextCursor::beginEditBlock((QTextCursor *)pQVar3);
  QByteArray::constData((QByteArray *)0x9fccf0);
  QByteArray::size((QByteArray *)pQVar3);
  md_parse((MD_CHAR *)in_stack_fffffffffffffe78,size,in_stack_fffffffffffffe68,pQVar3);
  QTextCursor::endEditBlock((QTextCursor *)pQVar3);
  QByteArray::~QByteArray((QByteArray *)0x9fcd2a);
  QFont::~QFont((QFont *)0x9fcd37);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextMarkdownImporter::import(const QString &markdown)
{
    MD_PARSER callbacks = {
        0, // abi_version
        unsigned(m_features),
        &CbEnterBlock,
        &CbLeaveBlock,
        &CbEnterSpan,
        &CbLeaveSpan,
        &CbText,
        &CbDebugLog,
        nullptr // syntax
    };
    QTextDocument *doc = m_cursor.document();
    const auto defaultFont = doc->defaultFont();
    m_paragraphMargin = defaultFont.pointSize() * 2 / 3;
    doc->clear();
    if (defaultFont.pointSize() != -1)
        m_monoFont.setPointSize(defaultFont.pointSize());
    else
        m_monoFont.setPixelSize(defaultFont.pixelSize());
    qCDebug(lcMD) << "default font" << defaultFont << "mono font" << m_monoFont;
    QStringView md = markdown;

    if (m_features.testFlag(QTextMarkdownImporter::FeatureFrontMatter)) {
        if (const auto split = splitFrontMatter(md)) {
            doc->setMetaInformation(QTextDocument::FrontMatter, split.frontMatter.toString());
            qCDebug(lcMD) << "extracted FrontMatter: size" << split.frontMatter.size();
            md = split.rest;
        }
    }

    const auto mdUtf8 = md.toUtf8();
    m_cursor.beginEditBlock();
    md_parse(mdUtf8.constData(), MD_SIZE(mdUtf8.size()), &callbacks, this);
    m_cursor.endEditBlock();
}